

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

shared_ptr<polyscope::render::TextureBuffer> __thiscall
polyscope::render::backend_openGL_mock::MockGLEngine::generateTextureBuffer
          (MockGLEngine *this,TextureFormat format,uint sizeX_,uint sizeY_,float *data)

{
  float *data_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<polyscope::render::TextureBuffer> sVar1;
  GLTextureBuffer *newT;
  element_type *this_00;
  uint in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffc8;
  TextureFormat in_stack_ffffffffffffffcc;
  GLTextureBuffer *in_stack_ffffffffffffffd0;
  
  this_00 = in_RDI;
  data_00 = (float *)operator_new(0x18);
  GLTextureBuffer::GLTextureBuffer
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc4,data_00);
  std::shared_ptr<polyscope::render::TextureBuffer>::
  shared_ptr<polyscope::render::backend_openGL_mock::GLTextureBuffer,void>
            ((shared_ptr<polyscope::render::TextureBuffer> *)this_00,(GLTextureBuffer *)in_RDI);
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_00;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextureBuffer> MockGLEngine::generateTextureBuffer(TextureFormat format, unsigned int sizeX_,
                                                                   unsigned int sizeY_, float* data) {
  GLTextureBuffer* newT = new GLTextureBuffer(format, sizeX_, sizeY_, data);
  return std::shared_ptr<TextureBuffer>(newT);
}